

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int pcut_get_test_timeout(pcut_item_t *test)

{
  pcut_extra_t *local_20;
  pcut_extra_t *extras;
  int timeout;
  pcut_item_t *test_local;
  
  extras._4_4_ = 3;
  for (local_20 = test->extras; local_20->type != 2; local_20 = local_20 + 1) {
    if (local_20->type == 0) {
      extras._4_4_ = local_20->timeout;
    }
  }
  return extras._4_4_;
}

Assistant:

int pcut_get_test_timeout(pcut_item_t *test) {
	int timeout = PCUT_DEFAULT_TEST_TIMEOUT;
	pcut_extra_t *extras = test->extras;


	while (extras->type != PCUT_EXTRA_LAST) {
		if (extras->type == PCUT_EXTRA_TIMEOUT) {
			timeout = extras->timeout;
		}
		extras++;
	}

	return timeout;
}